

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  ushort uVar1;
  int iVar2;
  uint8_t uVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  array_container_t *in_RAX;
  array_container_t *paVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  array_container_t *run;
  uint uVar12;
  array_container_t *local_38;
  
  iVar9 = x1_arr->size;
  if (((long)iVar9 == 0) || (x1_arr->keys[(long)iVar9 + -1] == hb)) {
    uVar6 = iVar9 - 1;
  }
  else if (iVar9 < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    iVar9 = iVar9 + -1;
    uVar12 = 0;
    do {
      uVar6 = iVar9 + uVar12 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(iVar9 + uVar12 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar12 = uVar6 + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_0011adf1;
        iVar9 = uVar6 - 1;
      }
    } while ((int)uVar12 <= iVar9);
    uVar6 = ~uVar12;
  }
LAB_0011adf1:
  iVar9 = ans_arr->size;
  if (((long)iVar9 == 0) || (ans_arr->keys[(long)iVar9 + -1] == hb)) {
    uVar12 = iVar9 - 1;
  }
  else if (iVar9 < 1) {
    uVar12 = 0xffffffff;
  }
  else {
    iVar9 = iVar9 + -1;
    uVar10 = 0;
    do {
      uVar12 = iVar9 + uVar10 >> 1;
      uVar1 = *(ushort *)((long)ans_arr->keys + (ulong)(iVar9 + uVar10 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar10 = uVar12 + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_0011ae0c;
        iVar9 = uVar12 - 1;
      }
    } while ((int)uVar10 <= iVar9);
    uVar12 = ~uVar10;
  }
LAB_0011ae0c:
  local_38 = in_RAX;
  if ((int)uVar6 < 0) {
    uVar6 = (uint)lb_start;
    uVar10 = lb_end + 1;
    if (uVar10 < uVar6) {
      __assert_fail("range_end >= range_start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
    }
    iVar9 = lb_end - uVar6;
    if (iVar9 + 2U < 3) {
      paVar7 = array_container_create_range(uVar6,uVar10);
      uVar3 = '\x02';
    }
    else {
      paVar7 = (array_container_t *)run_container_create_given_capacity(1);
      uVar3 = '\x03';
      if (paVar7 == (array_container_t *)0x0) {
        paVar7 = (array_container_t *)0x0;
      }
      else {
        iVar2 = paVar7->cardinality;
        *(uint *)(paVar7->array + (long)iVar2 * 2) = iVar9 * 0x10000 | uVar6;
        paVar7->cardinality = iVar2 + 1;
      }
    }
    goto LAB_0011b05b;
  }
  uVar3 = x1_arr->typecodes[uVar6 & 0xffff];
  paVar7 = (array_container_t *)x1_arr->containers[uVar6 & 0xffff];
  if (uVar3 == '\x04') {
    uVar3 = *(uint8_t *)&paVar7->array;
    if (uVar3 == '\x04') goto LAB_0011b075;
    paVar7 = *(array_container_t **)paVar7;
  }
  uVar6 = (uint)lb_start;
  iVar9 = lb_end + 1;
  local_38 = (array_container_t *)0x0;
  if (uVar3 == '\x03') {
    uVar6 = run_container_negation_range((run_container_t *)paVar7,uVar6,iVar9,&local_38);
    if (uVar6 != 4) goto LAB_0011af3f;
    uVar5 = *(uint8_t *)&local_38->array;
    if (uVar5 == '\x04') {
LAB_0011b075:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    run = *(array_container_t **)local_38;
    uVar3 = '\x04';
  }
  else {
    if (uVar3 == '\x02') {
      _Var4 = array_container_negation_range(paVar7,uVar6,iVar9,&local_38);
    }
    else {
      if (uVar3 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1848,
                      "container_t *container_not_range(const container_t *, uint8_t, uint32_t, uint32_t, uint8_t *)"
                     );
      }
      _Var4 = bitset_container_negation_range((bitset_container_t *)paVar7,uVar6,iVar9,&local_38);
    }
    uVar6 = (uint)(byte)(2 - _Var4);
LAB_0011af3f:
    uVar5 = (uint8_t)uVar6;
    run = local_38;
    uVar3 = uVar5;
  }
  paVar7 = local_38;
  if (uVar5 == '\x03') {
    lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar8 + 4) & 0x20) == 0) {
      iVar9 = run->cardinality;
      lVar8 = (long)iVar9;
      if (0 < lVar8) {
        lVar11 = 0;
        do {
          iVar9 = iVar9 + (uint)run->array[lVar11 * 2 + 1];
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
    }
    else {
      iVar9 = _avx2_run_container_cardinality((run_container_t *)run);
    }
  }
  else {
    if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
    }
    iVar9 = run->cardinality;
  }
  if (iVar9 == 0) {
    container_free(paVar7,uVar3);
    return;
  }
LAB_0011b05b:
  ra_insert_new_key_value_at(ans_arr,~uVar12,hb,paVar7,uVar3);
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}